

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property_int(nk_context *ctx,char *name,int min,int *val,int max,int step,
                    float inc_per_pixel)

{
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  nk_property_variant variant;
  nk_property_filter in_stack_000000c8;
  float in_stack_000000cc;
  nk_property_variant *in_stack_000000d0;
  char *in_stack_000000d8;
  nk_context *in_stack_000000e0;
  nk_property_variant local_80;
  undefined1 local_58 [8];
  int local_50;
  int *local_20;
  
  if ((((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) && (in_RSI != 0)) &&
     (in_RCX != (int *)0x0)) {
    local_20 = in_RCX;
    nk_property_variant_int(&local_80,*in_RCX,in_EDX,in_R8D,in_R9D);
    memcpy(local_58,&local_80,0x28);
    nk_property(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,
                in_stack_000000c8);
    *local_20 = local_50;
  }
  return;
}

Assistant:

NK_API void
nk_property_int(struct nk_context *ctx, const char *name,
int min, int *val, int max, int step, float inc_per_pixel)
{
struct nk_property_variant variant;
NK_ASSERT(ctx);
NK_ASSERT(name);
NK_ASSERT(val);

if (!ctx || !ctx->current || !name || !val) return;
variant = nk_property_variant_int(*val, min, max, step);
nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_INT);
*val = variant.value.i;
}